

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

_Bool junkscan(char *part,uint flags)

{
  _Bool _Var1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  if (part == (char *)0x0) {
    return false;
  }
  sVar2 = strlen(part);
  sVar3 = strcspn(part,
                  "\x01\x02\x03\x04\x05\x06\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f\x7f"
                 );
  if (sVar3 == sVar2) {
    if ((flags >> 0xb & 1) == 0) {
      pcVar4 = strchr(part,0x20);
      if (pcVar4 != (char *)0x0) goto LAB_005b05d2;
    }
    _Var1 = false;
  }
  else {
LAB_005b05d2:
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool junkscan(const char *part, unsigned int flags)
{
  if(part) {
    static const char badbytes[]={
      /* */ 0x01, 0x02, 0x03, 0x04, 0x05, 0x06, 0x07,
      0x08, 0x09, 0x0a, 0x0b, 0x0c, 0x0d, 0x0e, 0x0f,
      0x10, 0x11, 0x12, 0x13, 0x14, 0x15, 0x16, 0x17,
      0x18, 0x19, 0x1a, 0x1b, 0x1c, 0x1d, 0x1e, 0x1f,
      0x7f, 0x00 /* null-terminate */
    };
    size_t n = strlen(part);
    size_t nfine = strcspn(part, badbytes);
    if(nfine != n)
      /* since we don't know which part is scanned, return a generic error
         code */
      return TRUE;
    if(!(flags & CURLU_ALLOW_SPACE) && strchr(part, ' '))
      return TRUE;
  }
  return FALSE;
}